

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O1

void nni_task_fini(nni_task *task)

{
  nni_mtx *mtx;
  
  mtx = &task->task_mtx;
  nni_mtx_lock(mtx);
  if (task->task_busy != 0) {
    do {
      nni_cv_wait(&task->task_cv);
    } while (task->task_busy != 0);
  }
  nni_mtx_unlock(mtx);
  nni_cv_fini(&task->task_cv);
  nni_mtx_fini(mtx);
  return;
}

Assistant:

void
nni_task_fini(nni_task *task)
{
	nni_mtx_lock(&task->task_mtx);
	while (task->task_busy) {
		nni_cv_wait(&task->task_cv);
	}
	nni_mtx_unlock(&task->task_mtx);
	nni_cv_fini(&task->task_cv);
	nni_mtx_fini(&task->task_mtx);
}